

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fftpack.c
# Opt level: O3

int rffti1_(int *n,double *wa,double *fac)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  int iVar5;
  int unaff_EBP;
  int iVar6;
  ulong uVar7;
  uint uVar8;
  double *pdVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  int local_90;
  
  iVar6 = *n;
  uVar7 = 0;
  iVar3 = 0;
  iVar5 = iVar6;
  do {
    if (uVar7 < 4) {
      unaff_EBP = (&DAT_00138cb0)[uVar7];
    }
    else {
      unaff_EBP = unaff_EBP + 2;
    }
    uVar7 = uVar7 + 1;
    uVar8 = iVar3 + 2;
    pdVar9 = fac + (long)iVar3 + 2;
    uVar1 = (long)iVar3;
    while( true ) {
      uVar4 = uVar1;
      iVar3 = iVar5 / unaff_EBP;
      if (iVar5 != iVar3 * unaff_EBP) break;
      uVar1 = uVar4 + 1;
      fac[uVar4 + 2] = (double)unaff_EBP;
      if (uVar4 != 0 && unaff_EBP == 2) {
        if (0 < (long)uVar4) {
          lVar12 = 0;
          do {
            pdVar9[lVar12] = pdVar9[lVar12 + -1];
            lVar12 = lVar12 + -1;
          } while (2 - (ulong)uVar8 != lVar12);
        }
        fac[2] = 2.0;
      }
      uVar8 = uVar8 + 1;
      pdVar9 = pdVar9 + 1;
      iVar5 = iVar3;
      if (iVar3 == 1) {
        dVar13 = (double)iVar6;
        *fac = dVar13;
        fac[1] = (double)(int)uVar1;
        if (0 < (long)uVar4) {
          iVar6 = 0;
          local_90 = 1;
          uVar7 = 1;
          do {
            iVar5 = (int)fac[uVar7 + 1];
            iVar3 = *n / (local_90 * iVar5);
            if (1 < iVar5) {
              pdVar9 = wa + iVar6;
              iVar10 = 0;
              iVar11 = 1;
              do {
                iVar10 = iVar10 + local_90;
                if (2 < iVar3) {
                  dVar16 = 0.0;
                  lVar12 = 1;
                  do {
                    dVar16 = dVar16 + 1.0;
                    dVar14 = (double)iVar10 * (6.283185307179586 / dVar13) * dVar16;
                    dVar15 = cos(dVar14);
                    pdVar9[lVar12 + -1] = dVar15;
                    dVar14 = sin(dVar14);
                    pdVar9[lVar12] = dVar14;
                    iVar2 = (int)lVar12;
                    lVar12 = lVar12 + 2;
                  } while (iVar2 + 4 <= iVar3);
                }
                iVar11 = iVar11 + 1;
                pdVar9 = pdVar9 + iVar3;
              } while (iVar11 != iVar5);
              iVar6 = iVar6 + (iVar5 + -1) * iVar3;
            }
            uVar7 = uVar7 + 1;
            local_90 = local_90 * iVar5;
          } while (uVar7 != (uVar1 & 0xffffffff));
        }
        return 0;
      }
    }
    iVar3 = (int)uVar4;
  } while( true );
}

Assistant:

int rffti1_(int *n, fft_real_t *wa, fft_real_t *fac)
{
    /* Initialized data */

     int ntryh[4] = { 4,2,3,5 };

    /* System generated locals */
    int i__1, i__2, i__3;

    /* Builtin functions */

    /* Local variables */
     int i__, j, k1, l1, l2, ib;
     fft_real_t fi;
     int ld, ii, nf, ip, nl, is, nq, nr;
     fft_real_t arg;
     int ido, ipm;
     fft_real_t tpi;
     int nfm1;
     fft_real_t argh;
     int ntry;
     fft_real_t argld;

    /* Parameter adjustments */
    --wa;
    --fac;

    /* Function Body */

    nl = *n;
    nf = 0;
    j = 0;
L101:
    ++j;
    if (j - 4 <= 0) {
	goto L102;
    } else {
	goto L103;
    }
L102:
    ntry = ntryh[j - 1];
    goto L104;
L103:
    ntry += 2;
L104:
    nq = nl / ntry;
    nr = nl - ntry * nq;
    if (nr != 0) {
	goto L101;
    } else {
	goto L105;
    }
L105:
    ++nf;
    fac[nf + 2] = (fft_real_t) ntry;
    nl = nq;
    if (ntry != 2) {
	goto L107;
    }
    if (nf == 1) {
	goto L107;
    }
    i__1 = nf;
    for (i__ = 2; i__ <= i__1; ++i__) {
	ib = nf - i__ + 2;
	fac[ib + 2] = fac[ib + 1];
/* L106: */
    }
    fac[3] = 2.0;
L107:
    if (nl != 1) {
	goto L104;
    }
    fac[1] = (fft_real_t) (*n);
    fac[2] = (fft_real_t) nf;
    tpi = atan(1.) * 8.;
    argh = tpi / (fft_real_t) (*n);
    is = 0;
    nfm1 = nf - 1;
    l1 = 1;
    if (nfm1 == 0) {
	return 0;
    }
    i__1 = nfm1;
    for (k1 = 1; k1 <= i__1; ++k1) {
	ip = fac[k1 + 2];
	ld = 0;
	l2 = l1 * ip;
	ido = *n / l2;
	ipm = ip - 1;
	i__2 = ipm;
	for (j = 1; j <= i__2; ++j) {
	    ld += l1;
	    i__ = is;
	    argld = (fft_real_t) ld * argh;
	    fi = 0.0;
	    i__3 = ido;
	    for (ii = 3; ii <= i__3; ii += 2) {
		i__ += 2;
		fi += 1.0;
		arg = fi * argld;
		wa[i__ - 1] = cos(arg);
		wa[i__] = sin(arg);
/* L108: */
	    }
	    is += ido;
/* L109: */
	}
	l1 = l2;
/* L110: */
    }
    return 0;
}